

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall
ImDrawList::AddBezierQuadratic
          (ImDrawList *this,ImVec2 *p1,ImVec2 *p2,ImVec2 *p3,ImU32 col,float thickness,
          int num_segments)

{
  ImVec2 *__src;
  int iVar1;
  ImVec2 *__dest;
  int iVar2;
  int iVar3;
  
  if (0xffffff < col) {
    iVar1 = (this->_Path).Size;
    if (iVar1 == (this->_Path).Capacity) {
      if (iVar1 == 0) {
        iVar2 = 8;
      }
      else {
        iVar2 = iVar1 / 2 + iVar1;
      }
      iVar3 = iVar1 + 1;
      if (iVar1 + 1 < iVar2) {
        iVar3 = iVar2;
      }
      __dest = (ImVec2 *)ImGui::MemAlloc((long)iVar3 << 3);
      __src = (this->_Path).Data;
      if (__src != (ImVec2 *)0x0) {
        memcpy(__dest,__src,(long)(this->_Path).Size << 3);
        ImGui::MemFree((this->_Path).Data);
      }
      (this->_Path).Data = __dest;
      (this->_Path).Capacity = iVar3;
      iVar1 = (this->_Path).Size;
    }
    else {
      __dest = (this->_Path).Data;
    }
    __dest[iVar1] = *p1;
    (this->_Path).Size = (this->_Path).Size + 1;
    PathBezierQuadraticCurveTo(this,p2,p3,num_segments);
    AddPolyline(this,(this->_Path).Data,(this->_Path).Size,col,0,thickness);
    (this->_Path).Size = 0;
  }
  return;
}

Assistant:

void ImDrawList::AddBezierQuadratic(const ImVec2& p1, const ImVec2& p2, const ImVec2& p3, ImU32 col, float thickness, int num_segments)
{
    if ((col & IM_COL32_A_MASK) == 0)
        return;

    PathLineTo(p1);
    PathBezierQuadraticCurveTo(p2, p3, num_segments);
    PathStroke(col, 0, thickness);
}